

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::GatherBase::VerifyCompute(GatherBase *this)

{
  ulong uVar1;
  float fVar2;
  long lVar3;
  long lVar4;
  float *pfVar5;
  ulong uVar6;
  float afStack_14 [5];
  
  pfVar5 = (float *)glu::CallLogWrapper::glMapBufferRange
                              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.
                                super_CallLogWrapper,0x90d2,0,0x10,1);
  afStack_14[1] = 0.0;
  afStack_14[2] = 1.0;
  fVar2 = *pfVar5;
  if ((fVar2 == 0.0) && (!NAN(fVar2))) {
    uVar6 = 0xffffffffffffffff;
    do {
      if (uVar6 == 2) {
        return 0;
      }
      lVar3 = uVar6 + 2;
      uVar1 = uVar6 + 1;
      lVar4 = uVar6 + 1;
    } while ((pfVar5[lVar3] == afStack_14[lVar4]) &&
            (uVar6 = uVar1, !NAN(pfVar5[lVar3]) && !NAN(afStack_14[lVar4])));
    if (2 < uVar1) {
      return 0;
    }
  }
  anon_unknown_0::Output
            ("Expected Vec4(0, 1, 0, 1), got: %f, %f, %f, %f",SUB84((double)fVar2,0),
             (double)pfVar5[1],(double)pfVar5[2],(double)pfVar5[3]);
  return -1;
}

Assistant:

virtual long VerifyCompute()
	{
		Vec4* data;
		data = static_cast<Vec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(Vec4), GL_MAP_READ_BIT));
		if (data[0] != Vec4(0, 1, 0, 1))
		{
			Output("Expected Vec4(0, 1, 0, 1), got: %f, %f, %f, %f", data[0].x(), data[0].y(), data[0].z(),
				   data[0].w());
			return ERROR;
		}
		return NO_ERROR;
	}